

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O0

FRandom * ParseRNG(FScanner *sc)

{
  bool bVar1;
  FRandom *local_18;
  FRandom *rng;
  FScanner *sc_local;
  
  bVar1 = FScanner::CheckToken(sc,0x5b);
  if (bVar1) {
    FScanner::MustGetToken(sc,0x101);
    local_18 = FRandom::StaticFindRNG(sc->String);
    FScanner::MustGetToken(sc,0x5d);
  }
  else {
    local_18 = &pr_exrandom;
  }
  return local_18;
}

Assistant:

static FRandom *ParseRNG(FScanner &sc)
{
	FRandom *rng;

	if (sc.CheckToken('['))
	{
		sc.MustGetToken(TK_Identifier);
		rng = FRandom::StaticFindRNG(sc.String);
		sc.MustGetToken(']');
	}
	else
	{
		rng = &pr_exrandom;
	}
	return rng;
}